

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

int ParseHex(char *hex,FScriptPosition *sc)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  
  cVar1 = *hex;
  if (cVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    pcVar2 = hex + 1;
    iVar4 = 0;
    do {
      bVar3 = cVar1 - 0x30;
      if (9 < bVar3) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar3 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            if (sc != (FScriptPosition *)0x0) {
              FScriptPosition::Message(sc,0,"Bad hex number: %s");
              return 0;
            }
            Printf("Bad hex number: %s\n",hex);
            return 0;
          }
          bVar3 = cVar1 - 0x37;
        }
      }
      iVar4 = iVar4 * 0x10 + (uint)bVar3;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return iVar4;
}

Assistant:

int ParseHex (const char *hex, FScriptPosition *sc)
{
	const char *str;
	int num;

	num = 0;
	str = hex;

	while (*str)
	{
		num <<= 4;
		if (*str >= '0' && *str <= '9')
			num += *str-'0';
		else if (*str >= 'a' && *str <= 'f')
			num += 10 + *str-'a';
		else if (*str >= 'A' && *str <= 'F')
			num += 10 + *str-'A';
		else {
			if (!sc) Printf ("Bad hex number: %s\n",hex);
			else sc->Message(MSG_WARNING, "Bad hex number: %s", hex);
			return 0;
		}
		str++;
	}

	return num;
}